

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  bool y;
  char blue [8];
  
  builtin_strncpy(blue,"\x1b[1;34m",8);
  std::operator<<((ostream *)&std::cout,blue);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_709);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_742);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (y) {
    iVar2 = 10;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      poVar1 = std::operator<<((ostream *)&std::cout,"YESS...Uma ponte sob o abismo!");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Tente outra vez.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  int x = 1;
  bool y;

  char blue[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << blue;

  do
  {
    cout << "O homem é uma ponte, atada entre o animal e o super homem..." << endl;
    x++;
    break;
  } while (x <= 20);

  cout << endl;
  cout << "--------------------------------------------------------------------------" << endl;
  cout << "Foi Nietzsche quem disse isso? digite (1)sim ou (0)não: " << endl;
  cin >> y;

  if (y == 1)
    {
      for (int i = 1; i <= 10; i++)
      {
        cout << "YESS...Uma ponte sob o abismo!" << endl;
      }
    }
    else
    {
      cout << "Tente outra vez." << endl;
    }

  return 0;
}